

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O1

void aom_highbd_quantize_b_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  long lVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_60 [16];
  undefined1 auStack_50 [16];
  
  auVar21 = *(undefined1 (*) [16])zbin_ptr;
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar4 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar20 = vpsraw_avx(auVar21,0xf);
  auVar5 = vpunpcklwd_avx(auVar21,auVar20);
  auVar21 = vpunpckhwd_avx(auVar21,auVar20);
  auVar17._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar5;
  auVar17._16_16_ = ZEXT116(1) * auVar21;
  auVar21 = vpsraw_avx(auVar1,0xf);
  local_c0 = vpunpcklwd_avx(auVar1,auVar21);
  auStack_b0 = vpunpckhwd_avx(auVar1,auVar21);
  auVar21 = vpsraw_avx(auVar2,0xf);
  local_a0 = vpunpcklwd_avx(auVar2,auVar21);
  auStack_90 = vpunpckhwd_avx(auVar2,auVar21);
  auVar21 = vpsraw_avx(auVar3,0xf);
  local_80 = vpunpcklwd_avx(auVar3,auVar21);
  auStack_70 = vpunpckhwd_avx(auVar3,auVar21);
  auVar21 = vpsraw_avx(auVar4,0xf);
  local_60 = vpunpcklwd_avx(auVar4,auVar21);
  auStack_50 = vpunpckhwd_avx(auVar4,auVar21);
  auVar6 = vpcmpeqd_avx2(ZEXT1632(auStack_50),ZEXT1632(auStack_50));
  local_e0 = vpaddd_avx2(auVar17,auVar6);
  auVar6 = *(undefined1 (*) [32])coeff_ptr;
  auVar17 = vpabsd_avx2(auVar6);
  auVar19 = vpcmpgtd_avx2(auVar17,local_e0);
  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar19 >> 0x7f,0) == '\0') &&
        (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar19 >> 0xbf,0) == '\0') &&
      (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f]) {
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar16._0_32_;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar16._0_32_;
  }
  else {
    auVar18._16_16_ = auStack_b0;
    auVar18._0_16_ = local_c0;
    auVar17 = vpaddd_avx2(auVar17,auVar18);
    auVar17 = vpand_avx2(auVar19,auVar17);
    auVar22._16_16_ = auStack_90;
    auVar22._0_16_ = local_a0;
    auVar25._16_16_ = auStack_50;
    auVar25._0_16_ = local_60;
    auVar19 = vpmuldq_avx2(auVar17,auVar22);
    auVar23 = vpsrlq_avx2(auVar17,0x20);
    auVar18 = vpsrlq_avx2(auVar22,0x20);
    auVar18 = vpmuldq_avx2(auVar23,auVar18);
    auVar22 = vpsrlq_avx2(auVar19,0x10);
    auVar19 = vpsllq_avx2(auVar18,0x10);
    auVar19 = vpblendd_avx2(auVar22,auVar19,0xaa);
    auVar17 = vpaddd_avx2(auVar17,auVar19);
    auVar19 = vpmuldq_avx2(auVar17,auVar25);
    auVar17 = vpsrlq_avx2(auVar17,0x20);
    auVar18 = vpsrlq_avx2(auVar25,0x20);
    auVar17 = vpmuldq_avx2(auVar17,auVar18);
    auVar19 = vpsrlq_avx2(auVar19,0x10);
    auVar17 = vpsllq_avx2(auVar17,0x10);
    auVar18 = vpblendd_avx2(auVar19,auVar17,0xaa);
    auVar19._16_16_ = auStack_70;
    auVar19._0_16_ = local_80;
    auVar19 = vpmulld_avx2(auVar18,auVar19);
    auVar17 = vpcmpgtd_avx2(auVar18,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar18 = vpsignd_avx2(auVar18,auVar6);
    auVar6 = vpsignd_avx2(auVar19,auVar6);
    *(undefined1 (*) [32])qcoeff_ptr = auVar18;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar6;
    auVar6 = vpackssdw_avx2(auVar17,auVar17);
    auVar23._0_16_ = ZEXT116(1) * *(undefined1 (*) [16])iscan + ZEXT116(0) * auVar6._0_16_;
    auVar23._16_16_ = ZEXT116(1) * auVar6._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])iscan;
    auVar17 = vpermq_avx2(auVar6,0xd8);
    auVar6 = vpsubw_avx2(auVar23,auVar17);
    auVar6 = vpand_avx2(auVar6,auVar17);
    auVar6 = vpmaxsw_avx2(auVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar16 = ZEXT3264(auVar6);
  }
  auVar21 = auVar16._0_16_;
  lVar14 = 0;
  do {
    uVar8 = *(undefined8 *)(local_c0 + lVar14);
    uVar9 = *(undefined8 *)(local_c0 + lVar14 + 8);
    *(undefined8 *)(local_e0 + lVar14) = uVar8;
    *(undefined8 *)(local_e0 + lVar14 + 8) = uVar9;
    *(undefined8 *)(local_e0 + lVar14 + 0x10) = uVar8;
    *(undefined8 *)(local_e0 + lVar14 + 0x18) = uVar9;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0xa0);
  if (8 < n_coeffs) {
    auVar10._16_16_ = auStack_b0;
    auVar10._0_16_ = local_c0;
    auVar11._16_16_ = auStack_90;
    auVar11._0_16_ = local_a0;
    auVar12._16_16_ = auStack_70;
    auVar12._0_16_ = local_80;
    auVar17 = vpsrad_avx2(auVar11,0x1f);
    auVar6 = vpshufd_avx2(auVar11,0xf5);
    auVar17 = vpblendd_avx2(auVar6,auVar17,0xaa);
    auVar13._16_16_ = auStack_50;
    auVar13._0_16_ = local_60;
    auVar19 = vpsrad_avx2(auVar13,0x1f);
    auVar6 = vpshufd_avx2(auVar13,0xf5);
    auVar6 = vpblendd_avx2(auVar6,auVar19,0xaa);
    lVar15 = n_coeffs + 8;
    lVar14 = 0x10;
    auVar19 = vpsrlq_avx2(auVar17,0x20);
    do {
      auVar18 = *(undefined1 (*) [32])((long)coeff_ptr + lVar14 * 2);
      auVar22 = vpabsd_avx2(auVar18);
      auVar25 = vpcmpgtd_avx2(auVar22,local_e0);
      auVar23 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0x7f,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0xbf,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar14 * 2) = auVar23;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar14 * 2) = auVar23;
      }
      else {
        auVar22 = vpaddd_avx2(auVar22,auVar10);
        auVar25 = vpand_avx2(auVar25,auVar22);
        auVar24 = vpmuldq_avx2(auVar25,auVar11);
        auVar26 = vpsrad_avx2(auVar25,0x1f);
        auVar7 = vpshufd_avx2(auVar25,0xf5);
        auVar22 = vpmuludq_avx2(auVar7,auVar19);
        auVar26 = vpsrlq_avx2(auVar26,0x20);
        auVar26 = vpmuludq_avx2(auVar26,auVar17);
        auVar22 = vpaddq_avx2(auVar22,auVar26);
        auVar26 = vpsllq_avx2(auVar22,0x20);
        auVar22 = vpmuludq_avx2(auVar7,auVar17);
        auVar22 = vpaddq_avx2(auVar22,auVar26);
        auVar24 = vpsrlq_avx2(auVar24,0x10);
        auVar22 = vpsllq_avx2(auVar22,0x10);
        auVar22 = vpblendd_avx2(auVar24,auVar22,0xaa);
        auVar22 = vpaddd_avx2(auVar25,auVar22);
        auVar25 = vpmuldq_avx2(auVar22,auVar13);
        auVar24 = vpsrad_avx2(auVar22,0x1f);
        auVar26 = vpshufd_avx2(auVar22,0xf5);
        auVar22 = vpsrlq_avx2(auVar6,0x20);
        auVar22 = vpmuludq_avx2(auVar26,auVar22);
        auVar24 = vpsrlq_avx2(auVar24,0x20);
        auVar24 = vpmuludq_avx2(auVar24,auVar6);
        auVar22 = vpaddq_avx2(auVar22,auVar24);
        auVar24 = vpsllq_avx2(auVar22,0x20);
        auVar22 = vpmuludq_avx2(auVar26,auVar6);
        auVar22 = vpaddq_avx2(auVar22,auVar24);
        auVar25 = vpsrlq_avx2(auVar25,0x10);
        auVar22 = vpsllq_avx2(auVar22,0x10);
        auVar24 = vpblendd_avx2(auVar25,auVar22,0xaa);
        auVar25 = vpmulld_avx2(auVar12,auVar24);
        auVar22 = vpcmpgtd_avx2(auVar24,auVar23);
        auVar23 = vpsignd_avx2(auVar24,auVar18);
        auVar18 = vpsignd_avx2(auVar25,auVar18);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar14 * 2) = auVar23;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar14 * 2) = auVar18;
        auVar18 = vpackssdw_avx2(auVar22,auVar22);
        auVar24._0_16_ =
             ZEXT116(0) * auVar16._0_16_ + ZEXT116(1) * *(undefined1 (*) [16])((long)iscan + lVar14)
        ;
        auVar24._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16._0_16_;
        auVar22 = vpermq_avx2(auVar18,0xd8);
        auVar18 = vpsubw_avx2(auVar24,auVar22);
        auVar18 = vpand_avx2(auVar18,auVar22);
        auVar18 = vpmaxsw_avx2(auVar18,auVar16._0_32_);
        auVar16 = ZEXT3264(auVar18);
      }
      auVar21 = auVar16._0_16_;
      lVar14 = lVar14 + 0x10;
      lVar15 = lVar15 + -8;
    } while (0x10 < lVar15);
  }
  auVar1 = vpshufd_avx(auVar21,0xe);
  auVar21 = vpmaxsw_avx(auVar21,auVar1);
  auVar1 = vpshuflw_avx(auVar21,0xe);
  auVar21 = vpmaxsw_avx(auVar21,auVar1);
  auVar1 = vpshuflw_avx(auVar21,1);
  auVar21 = vpmaxsw_avx(auVar21,auVar1);
  vpextrw_avx(auVar21,0);
  return;
}

Assistant:

void aom_highbd_quantize_b_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];

  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 0);

  quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}